

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void countStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  long *plVar2;
  CountCtx *p;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  plVar2 = (long *)sqlite3_aggregate_context(context,8);
  if ((argc != 0) && (iVar1 = sqlite3_value_type(*argv), iVar1 == 5)) {
    return;
  }
  if (plVar2 != (long *)0x0) {
    *plVar2 = *plVar2 + 1;
  }
  return;
}

Assistant:

static void countStep(sqlite3_context *context, int argc, sqlite3_value **argv){
  CountCtx *p;
  p = sqlite3_aggregate_context(context, sizeof(*p));
  if( (argc==0 || SQLITE_NULL!=sqlite3_value_type(argv[0])) && p ){
    p->n++;
  }

#ifndef SQLITE_OMIT_DEPRECATED
  /* The sqlite3_aggregate_count() function is deprecated.  But just to make
  ** sure it still operates correctly, verify that its count agrees with our 
  ** internal count when using count(*) and when the total count can be
  ** expressed as a 32-bit integer. */
  assert( argc==1 || p==0 || p->n>0x7fffffff || p->bInverse
          || p->n==sqlite3_aggregate_count(context) );
#endif
}